

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cryptor.c
# Opt level: O0

int aes_ctr_init(archive_crypto_ctx *ctx,uint8_t *key,size_t key_len)

{
  EVP_CIPHER_CTX *pEVar1;
  EVP_CIPHER *pEVar2;
  size_t key_len_local;
  uint8_t *key_local;
  archive_crypto_ctx *ctx_local;
  
  pEVar1 = EVP_CIPHER_CTX_new();
  ctx->ctx = (EVP_CIPHER_CTX *)pEVar1;
  if (pEVar1 == (EVP_CIPHER_CTX *)0x0) {
    ctx_local._4_4_ = -1;
  }
  else {
    if (key_len == 0x10) {
      pEVar2 = EVP_aes_128_ecb();
      ctx->type = (EVP_CIPHER *)pEVar2;
    }
    else if (key_len == 0x18) {
      pEVar2 = EVP_aes_192_ecb();
      ctx->type = (EVP_CIPHER *)pEVar2;
    }
    else {
      if (key_len != 0x20) {
        ctx->type = (EVP_CIPHER *)0x0;
        return -1;
      }
      pEVar2 = EVP_aes_256_ecb();
      ctx->type = (EVP_CIPHER *)pEVar2;
    }
    ctx->key_len = (uint)key_len;
    memcpy(ctx->key,key,key_len);
    memset(ctx->nonce,0,0x10);
    ctx->encr_pos = 0x10;
    EVP_CIPHER_CTX_reset(ctx->ctx);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int
aes_ctr_init(archive_crypto_ctx *ctx, const uint8_t *key, size_t key_len)
{
	if ((ctx->ctx = EVP_CIPHER_CTX_new()) == NULL)
		return -1;

	switch (key_len) {
	case 16: ctx->type = EVP_aes_128_ecb(); break;
	case 24: ctx->type = EVP_aes_192_ecb(); break;
	case 32: ctx->type = EVP_aes_256_ecb(); break;
	default: ctx->type = NULL; return -1;
	}

	ctx->key_len = key_len;
	memcpy(ctx->key, key, key_len);
	memset(ctx->nonce, 0, sizeof(ctx->nonce));
	ctx->encr_pos = AES_BLOCK_SIZE;
	EVP_CIPHER_CTX_init(ctx->ctx);
	return 0;
}